

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

void uv__stream_io(uv_loop_t *loop,uv__io_t *w,uint events)

{
  byte *pbVar1;
  uv_stream_t *stream;
  size_t sVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  cmsghdr *__cmsg;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  msghdr msg;
  int error;
  uv_buf_t local_1c0;
  int local_1ac;
  ulong local_1a8;
  long local_1a0;
  ulong local_198;
  int local_18c;
  msghdr local_188;
  size_t local_150;
  cmsghdr local_148 [17];
  
  if ((0xe < (uint)w[-3].fd) || ((0x5080U >> (w[-3].fd & 0x1fU) & 1) == 0)) {
    __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE || stream->type == UV_TTY"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x505,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  if (((ulong)w[-1].pending_queue[0] & 1) != 0) {
    __assert_fail("!(stream->flags & UV_CLOSING)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x506,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  stream = (uv_stream_t *)(w[-3].watcher_queue + 1);
  lVar6._0_4_ = w[-1].pevents;
  lVar6._4_4_ = w[-1].events;
  if (lVar6 == 0) {
    if (w->fd < 0) {
      __assert_fail("uv__stream_fd(stream) >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x50d,"void uv__stream_io(uv_loop_t *, uv__io_t *, unsigned int)");
    }
    if ((events & 0x19) != 0) {
      pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
      *pbVar1 = *pbVar1 & 0xfe;
      local_1a8 = 0;
      if (w[-3].fd == 7) {
        local_1a8 = (ulong)(*(int *)&w[2].cb != 0);
      }
      iVar10 = 0x20;
      do {
        if (((w[-1].watcher_queue[1] == (void *)0x0) || (((ulong)w[-1].pending_queue[0] & 4) == 0))
           || (iVar10 == 0)) goto LAB_00544beb;
        local_18c = iVar10 + -1;
        if (w[-1].watcher_queue[0] == (void *)0x0) {
          __assert_fail("stream->alloc_cb != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x46c,"void uv__read(uv_stream_t *)");
        }
        local_1c0 = uv_buf_init((char *)0x0,0);
        (*(code *)w[-1].watcher_queue[0])(stream,0x10000,&local_1c0);
        if ((local_1c0.base == (char *)0x0) || (local_1c0.len == 0)) {
          lVar6 = -0x69;
LAB_00544be8:
          (*(code *)w[-1].watcher_queue[1])(stream,lVar6,&local_1c0);
          goto LAB_00544beb;
        }
        if (w->fd < 0) {
          __assert_fail("uv__stream_fd(stream) >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                        ,0x477,"void uv__read(uv_stream_t *)");
        }
        if ((char)local_1a8 == '\0') {
          do {
            lVar6 = read(w->fd,local_1c0.base,local_1c0.len);
            if (-1 < lVar6) break;
            piVar7 = __errno_location();
          } while (*piVar7 == 4);
        }
        else {
          local_188.msg_flags = 0;
          local_188.msg_iov = (iovec *)&local_1c0;
          local_188.msg_iovlen = 1;
          local_188.msg_name = (void *)0x0;
          local_188.msg_namelen = 0;
          local_188.msg_controllen = 0x110;
          local_188.msg_control = local_148;
          do {
            lVar6 = uv__recvmsg(w->fd,&local_188,0);
            if (-1 < lVar6) break;
            piVar7 = __errno_location();
          } while (*piVar7 == 4);
        }
        if (lVar6 < 0) {
          piVar7 = __errno_location();
          if ((long)*piVar7 == 0xb) {
            if (((ulong)w[-1].pending_queue[0] & 4) != 0) {
              uv__io_start(*(uv_loop_t **)&w[-3].pevents,w,1);
            }
            lVar6 = 0;
            goto LAB_00544be8;
          }
          (*(code *)w[-1].watcher_queue[1])(stream,-(long)*piVar7,&local_1c0);
          if ((*(uint *)w[-1].pending_queue & 4) != 0) {
            *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xfffffffb;
            uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,1);
            iVar10 = uv__io_active(w,4);
            if (((iVar10 == 0) && (uVar3 = *(uint *)w[-1].pending_queue, (uVar3 >> 0xe & 1) != 0))
               && (*(uint *)w[-1].pending_queue = uVar3 & 0xffffbfff, (uVar3 >> 0xd & 1) != 0)) {
              piVar7 = (int *)(*(long *)&w[-3].pevents + 8);
              *piVar7 = *piVar7 + -1;
            }
          }
          goto LAB_00544beb;
        }
        if (lVar6 == 0) {
          uv__stream_eof(stream,&local_1c0);
          goto LAB_00544beb;
        }
        local_150 = local_1c0.len;
        if ((char)local_1a8 != '\0') {
          __cmsg = (cmsghdr *)local_188.msg_control;
          iVar10 = 0;
          lVar5 = lVar6;
          if ((cmsghdr *)local_188.msg_control != (cmsghdr *)0x0 && 0xf < local_188.msg_controllen)
          {
            do {
              local_1a0 = lVar5;
              if (__cmsg->cmsg_type == 1) {
                uVar13 = 0xffffffff;
                uVar3 = 0;
                do {
                  uVar8 = uVar3;
                  uVar12 = (int)uVar13 + 1;
                  uVar13 = (ulong)uVar12;
                  sVar2 = uVar13 * 4 + 0x10;
                  uVar3 = uVar8 + 1;
                } while ((long)sVar2 < (long)__cmsg->cmsg_len);
                if (sVar2 != __cmsg->cmsg_len) {
                  __assert_fail("start + CMSG_LEN(count * sizeof(*pi)) == end",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                                ,0x439,"int uv__stream_recv_cmsg(uv_stream_t *, struct msghdr *)");
                }
                bVar4 = false;
                if (uVar12 != 0) {
                  uVar11 = (ulong)uVar8;
                  uVar9 = 0;
                  local_198 = uVar11;
                  do {
                    uVar3 = *(uint *)((long)&__cmsg[1].cmsg_len + uVar9 * 4);
                    if (w[1].events != 0xffffffff) {
                      piVar7 = *(int **)&w[1].fd;
                      if (piVar7 == (int *)0x0) {
                        piVar7 = (int *)uv__malloc(0x28);
                        if (piVar7 != (int *)0x0) {
                          piVar7[0] = 8;
                          piVar7[1] = 0;
LAB_0054493e:
                          *(int **)&w[1].fd = piVar7;
                          goto LAB_0054494f;
                        }
                        iVar10 = -0xc;
                        bVar4 = false;
                      }
                      else {
                        iVar10 = *piVar7;
                        uVar11 = local_198;
                        if (iVar10 == piVar7[1]) {
                          piVar7 = (int *)uv__realloc(piVar7,(ulong)(iVar10 + 7) * 4 + 0xc);
                          uVar11 = local_198;
                          if (piVar7 != (int *)0x0) {
                            *piVar7 = iVar10 + 8;
                            goto LAB_0054493e;
                          }
                          iVar10 = -0xc;
                          bVar4 = false;
                        }
                        else {
LAB_0054494f:
                          uVar8 = piVar7[1];
                          piVar7[1] = uVar8 + 1;
                          piVar7[(ulong)uVar8 + 2] = uVar3;
                          iVar10 = 0;
                          bVar4 = true;
                        }
                      }
                      if (bVar4) goto LAB_00544966;
                      if ((uint)uVar9 < uVar12) {
                        do {
                          uv__close(*(int *)((long)&__cmsg[1].cmsg_len + uVar9 * 4));
                          uVar9 = uVar9 + 1;
                        } while (uVar9 < uVar13);
                      }
                      bVar4 = true;
                      lVar6 = local_1a0;
                      local_1ac = iVar10;
                      goto LAB_005449eb;
                    }
                    w[1].events = uVar3;
LAB_00544966:
                    uVar9 = uVar9 + 1;
                  } while (uVar11 != uVar9);
                  bVar4 = false;
                  lVar6 = local_1a0;
                }
              }
              else {
                fprintf(_stderr,"ignoring non-SCM_RIGHTS ancillary data: %d\n");
                bVar4 = false;
              }
LAB_005449eb:
              iVar10 = local_1ac;
              if (bVar4) goto LAB_00544a0f;
              __cmsg = __cmsg_nxthdr((msghdr *)&local_188,__cmsg);
              lVar5 = local_1a0;
            } while (__cmsg != (cmsghdr *)0x0);
            iVar10 = 0;
          }
LAB_00544a0f:
          if (iVar10 != 0) {
            lVar6 = (long)iVar10;
            goto LAB_00544be8;
          }
        }
        (*(code *)w[-1].watcher_queue[1])(stream,lVar6,&local_1c0);
        iVar10 = local_18c;
      } while ((long)local_150 <= lVar6);
      pbVar1 = (byte *)((long)w[-1].pending_queue + 1);
      *pbVar1 = *pbVar1 | 1;
    }
LAB_00544beb:
    if (w->fd != -1) {
      if (((events & 0x10) != 0) && (((ulong)w[-1].pending_queue[0] & 0x304) == 0x104)) {
        local_148[0].cmsg_len = 0;
        local_148[0].cmsg_level = 0;
        local_148[0].cmsg_type = 0;
        uv__stream_eof(stream,(uv_buf_t *)local_148);
      }
      if (((events & 0x1c) != 0) && (w->fd != -1)) {
        uv__write(stream);
        uv__write_callbacks(stream);
        if (w + 1 == (uv__io_t *)w[1].cb) {
          if (w + 1 != (uv__io_t *)w[1].cb) {
            __assert_fail("QUEUE_EMPTY(&stream->write_queue)",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                          ,0x29a,"void uv__drain(uv_stream_t *)");
          }
          uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
          if ((*(uint *)w[-1].pending_queue & 0x19) == 8) {
            lVar6 = *(long *)&w[-1].fd;
            if (lVar6 == 0) {
              __assert_fail("stream->shutdown_req",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                            ,0x2a2,"void uv__drain(uv_stream_t *)");
            }
            *(undefined8 *)&w[-1].fd = 0;
            *(uint *)w[-1].pending_queue = *(uint *)w[-1].pending_queue & 0xffffffe6;
            if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
              __assert_fail("uv__has_active_reqs(stream->loop)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                            ,0x2a7,"void uv__drain(uv_stream_t *)");
            }
            **(undefined8 **)(lVar6 + 0x18) = *(undefined8 *)(lVar6 + 0x10);
            *(undefined8 *)(*(long *)(lVar6 + 0x10) + 8) = *(undefined8 *)(lVar6 + 0x18);
            iVar10 = shutdown(w->fd,1);
            if (iVar10 == 0) {
              iVar10 = 0;
            }
            else {
              piVar7 = __errno_location();
              iVar10 = -*piVar7;
            }
            if (iVar10 == 0) {
              *(byte *)w[-1].pending_queue = *(byte *)w[-1].pending_queue | 0x10;
            }
            if (*(code **)(lVar6 + 0x48) != (code *)0x0) {
              (**(code **)(lVar6 + 0x48))(lVar6);
            }
          }
        }
      }
    }
  }
  else {
    lVar6 = *(long *)&w[-1].pevents;
    local_188.msg_name = (void *)CONCAT44(local_188.msg_name._4_4_,4);
    if ((w[-3].fd != 7) && (w[-3].fd != 0xc)) {
      __assert_fail("stream->type == UV_TCP || stream->type == UV_NAMED_PIPE",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x53c,"void uv__stream_connect(uv_stream_t *)");
    }
    if (lVar6 == 0) {
      __assert_fail("req",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x53d,"void uv__stream_connect(uv_stream_t *)");
    }
    if (w[1].pevents == 0) {
      if (w->fd < 0) {
        __assert_fail("uv__stream_fd(stream) >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x548,"void uv__stream_connect(uv_stream_t *)");
      }
      getsockopt(w->fd,1,4,local_148,(socklen_t *)&local_188);
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,-(int)local_148[0].cmsg_len);
    }
    else {
      local_148[0].cmsg_len = CONCAT44(local_148[0].cmsg_len._4_4_,w[1].pevents);
      w[1].pevents = 0;
    }
    if ((int)local_148[0].cmsg_len != -0x73) {
      w[-1].pevents = 0;
      w[-1].events = 0;
      if (*(long *)&w[-3].pevents + 0x20 == *(long *)(*(long *)&w[-3].pevents + 0x20)) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x555,"void uv__stream_connect(uv_stream_t *)");
      }
      **(undefined8 **)(lVar6 + 0x18) = *(undefined8 *)(lVar6 + 0x10);
      *(undefined8 *)(*(long *)(lVar6 + 0x10) + 8) = *(undefined8 *)(lVar6 + 0x18);
      if (((int)local_148[0].cmsg_len < 0) || (w + 1 == (uv__io_t *)w[1].cb)) {
        uv__io_stop(*(uv_loop_t **)&w[-3].pevents,w,4);
      }
      if (*(code **)(lVar6 + 0x40) != (code *)0x0) {
        (**(code **)(lVar6 + 0x40))(lVar6,local_148[0].cmsg_len & 0xffffffff);
      }
      if ((w->fd != -1) && ((int)local_148[0].cmsg_len < 0)) {
        uv__stream_flush_write_queue(stream,-0x7d);
        uv__write_callbacks(stream);
      }
    }
  }
  return;
}

Assistant:

static void uv__stream_io(uv_loop_t* loop, uv__io_t* w, unsigned int events) {
  uv_stream_t* stream;

  stream = container_of(w, uv_stream_t, io_watcher);

  assert(stream->type == UV_TCP ||
         stream->type == UV_NAMED_PIPE ||
         stream->type == UV_TTY);
  assert(!(stream->flags & UV_CLOSING));

  if (stream->connect_req) {
    uv__stream_connect(stream);
    return;
  }

  assert(uv__stream_fd(stream) >= 0);

  /* Ignore POLLHUP here. Even it it's set, there may still be data to read. */
  if (events & (POLLIN | POLLERR | POLLHUP))
    uv__read(stream);

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  /* Short-circuit iff POLLHUP is set, the user is still interested in read
   * events and uv__read() reported a partial read but not EOF. If the EOF
   * flag is set, uv__read() called read_cb with err=UV_EOF and we don't
   * have to do anything. If the partial read flag is not set, we can't
   * report the EOF yet because there is still data to read.
   */
  if ((events & POLLHUP) &&
      (stream->flags & UV_STREAM_READING) &&
      (stream->flags & UV_STREAM_READ_PARTIAL) &&
      !(stream->flags & UV_STREAM_READ_EOF)) {
    uv_buf_t buf = { NULL, 0 };
    uv__stream_eof(stream, &buf);
  }

  if (uv__stream_fd(stream) == -1)
    return;  /* read_cb closed stream. */

  if (events & (POLLOUT | POLLERR | POLLHUP)) {
    uv__write(stream);
    uv__write_callbacks(stream);

    /* Write queue drained. */
    if (QUEUE_EMPTY(&stream->write_queue))
      uv__drain(stream);
  }
}